

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextAutomata.h
# Opt level: O0

int __thiscall bwtil::ContextAutomata::init(ContextAutomata *this,EVP_PKEY_CTX *ctx)

{
  value_type vVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  bool bVar2;
  value_type vVar3;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  ostream *poVar5;
  void *pvVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  byte *pbVar10;
  byte in_DL;
  reference rVar11;
  uint i_3;
  uint i_2;
  uint i_1;
  symbol s;
  int last_perc;
  int perc;
  vector<bool,_std::allocator<bool>_> inserted;
  ulint symbols_read;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe08;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe30;
  uint local_104;
  uint local_100;
  uint local_fc;
  reference local_e8;
  reference local_d8;
  char local_c5;
  int local_c4;
  int local_c0;
  undefined1 local_b9;
  long local_90;
  undefined1 local_88 [16];
  pointer local_78;
  uint local_68;
  byte local_11;
  EVP_PKEY_CTX *local_10;
  ContextAutomata *local_8;
  
  local_11 = in_DL & 1;
  local_10 = ctx;
  local_8 = this;
  if (local_11 != 0) {
    std::operator<<((ostream *)&std::cout,"\n*** Building context automata ***\n\n");
  }
  this->bwIt = (BackwardIterator *)local_10;
  iVar4 = (*this->bwIt->_vptr_BackwardIterator[6])();
  this->n = CONCAT44(extraout_var,iVar4);
  this->null_ptr = 0xffffffff;
  if ((local_11 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout," Text length is ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,this->n);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14a82e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,(allocator_type *)in_stack_fffffffffffffe20._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe20._M_current,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe20._M_current);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14a885);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x14a89a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,(allocator_type *)in_stack_fffffffffffffe20._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffe20._M_current,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffe20._M_current);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x14a8e9);
  for (local_68 = 0; local_68 < 0x100; local_68 = local_68 + 1) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->remapping,(ulong)local_68);
    *pvVar7 = 0x100;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->inverse_remapping,(ulong)local_68);
    *pvVar8 = '\0';
  }
  if ((local_11 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\n scanning file to detect alphabet ... ");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  local_88 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x14a9f3);
  local_90 = 0;
  local_b9 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x14aa1c);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (bool *)in_stack_fffffffffffffe20._M_current,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  std::allocator<bool>::~allocator((allocator<bool> *)0x14aa4d);
  local_c4 = -1;
  while( true ) {
    iVar4 = (*this->bwIt->_vptr_BackwardIterator[4])();
    if ((((byte)iVar4 ^ 0xff) & 1) == 0) {
      if ((local_11 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout," done.\n\n Sorting alphabet ... ");
        std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffe08);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe08);
      __last._M_current._7_1_ = in_stack_fffffffffffffe1f;
      __last._M_current._0_7_ = in_stack_fffffffffffffe18;
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (in_stack_fffffffffffffe20,__last);
      if ((local_11 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"done. Alphabet size: sigma = ");
        sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
        pvVar6 = (void *)std::ostream::operator<<(poVar5,sVar9);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      }
      this->sigma = 1;
      local_fc = 0;
      while( true ) {
        sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
        if (sVar9 <= local_fc) break;
        pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->remapping,(ulong)*pbVar10);
        if (*pvVar7 == 0x100) {
          vVar1 = this->sigma;
          pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->remapping,(ulong)*pbVar10);
          *pvVar7 = vVar1;
          this->sigma = this->sigma + 1;
        }
        local_fc = local_fc + 1;
      }
      if ((local_11 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"\n Alphabet (ASCII codes) = { ");
      }
      local_100 = 0;
      while( true ) {
        sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
        if (sVar9 <= local_100) break;
        if ((local_11 & 1) != 0) {
          pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(ulong)*pbVar10);
          std::operator<<(poVar5,' ');
        }
        local_100 = local_100 + 1;
      }
      if ((local_11 & 1) != 0) {
        in_stack_fffffffffffffe20._M_current = (uchar *)std::operator<<((ostream *)&std::cout,"}");
        std::ostream::operator<<
                  (in_stack_fffffffffffffe20._M_current,std::endl<char,std::char_traits<char>>);
      }
      this->TERMINATOR = '\0';
      for (local_104 = 1; local_104 < 0x100; local_104 = local_104 + 1) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->remapping,(ulong)local_104);
        if (*pvVar7 != 0x100) {
          vVar3 = (value_type)local_104;
          this_00 = &this->inverse_remapping;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->remapping,(ulong)local_104);
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (this_00,(ulong)*pvVar7);
          *pvVar8 = vVar3;
        }
      }
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->inverse_remapping,(ulong)this->TERMINATOR);
      *pvVar8 = '\0';
      (*this->bwIt->_vptr_BackwardIterator[2])();
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x14b0b8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe20._M_current);
      return extraout_EAX;
    }
    iVar4 = (*this->bwIt->_vptr_BackwardIterator[3])();
    local_c5 = (char)iVar4;
    if (local_c5 == '\0') break;
    rVar11 = std::vector<bool,_std::allocator<bool>_>::at
                       (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
    local_d8 = rVar11;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_d8);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      rVar11 = std::vector<bool,_std::allocator<bool>_>::at
                         (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
      local_e8 = rVar11;
      std::_Bit_reference::operator=(&local_e8,true);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe20._M_current,
                 (value_type_conflict1 *)
                 CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    }
    local_c0 = (int)((ulong)(local_90 * 100) / this->n);
    if (((local_c4 < local_c0) && (local_c0 % 5 == 0)) && ((local_11 & 1) != 0)) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c0);
      poVar5 = std::operator<<(poVar5,"% done.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_c4 = local_c0;
    }
    local_90 = local_90 + 1;
  }
  std::operator<<((ostream *)&std::cout,
                  "ERROR while reading input text : the text contains a 0x0 byte.\n");
  exit(0);
}

Assistant:

void init(BackwardIterator * bfr, bool verbose){

		if(verbose) cout << "\n*** Building context automata ***\n\n";

		bwIt = bfr;

		n = bwIt->length();
		null_ptr = ~((uint)0);

		if(verbose) cout << " Text length is " << n << endl;

		remapping = vector<uint>(256);
		inverse_remapping = vector<symbol>(256);

		for(uint i=0;i<256;i++){
			remapping[i]=empty;
			inverse_remapping[i]=0;
		}

		if(verbose) cout << "\n scanning file to detect alphabet ... " << endl;

		vector<symbol> alphabet = vector<symbol>();

		ulint symbols_read=0;
		vector<bool> inserted = vector<bool>(256,false);

		int perc,last_perc=-1;

		while(not bwIt->begin()){

			symbol s = bwIt->read();

			if(s==0){

				cout << "ERROR while reading input text : the text contains a 0x0 byte.\n";
				exit(0);

			}

			if(not inserted.at(s)){
				inserted.at(s) = true;
				alphabet.push_back(s);
			}

			perc = (100*symbols_read)/n;

			if(perc>last_perc and (perc%5)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}

			symbols_read++;

		}

		if(verbose) cout << " done.\n\n Sorting alphabet ... " << flush;

		std::sort(alphabet.begin(),alphabet.end());

		if(verbose) cout << "done. Alphabet size: sigma = " << alphabet.size() << endl;

		sigma = 1;//code 0x0 is for the terminator

		//if(verbose) cout << "\n Alphabet = { ";

		for (uint i=0;i<alphabet.size();i++){

			if(remapping[alphabet.at(i)]==empty){//new symbol

				remapping[alphabet.at(i)] = sigma;
				sigma++;

			}

			//if(verbose) cout << alphabet.at(i) << ' ';

		}

		//if(verbose) cout << "}\n\n";

		if(verbose) cout << "\n Alphabet (ASCII codes) = { ";

		for (uint i=0;i<alphabet.size();i++)
			if(verbose) cout << (ulint)alphabet.at(i) << ' ';

		if(verbose) cout << "}" << endl;

		TERMINATOR = 0;

		for(uint i=1;i<256;i++)
			if(remapping[i]!=empty)
				inverse_remapping[remapping[i]] = i;

		inverse_remapping[TERMINATOR] = 0;//0 is the terminator appended in the file

		bwIt->rewind();

	}